

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::visitBranch
          (TGlslangToSpvTraverser *this,TVisit param_1,TIntermBranch *node)

{
  Builder *this_00;
  TIntermTyped *pTVar1;
  Instruction *pIVar2;
  int iVar3;
  int iVar4;
  Id rValue;
  Id IVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TType *type;
  _Elt_pointer pbVar6;
  undefined4 extraout_var_02;
  char *pcVar7;
  Op opcode;
  Decoration DVar8;
  Capability local_38 [2];
  undefined4 extraout_var_01;
  
  pTVar1 = node->expression;
  if (pTVar1 != (TIntermTyped *)0x0) {
    (*(pTVar1->super_TIntermNode)._vptr_TIntermNode[2])(pTVar1,this);
  }
  this_00 = &this->builder;
  iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
  iVar3 = *(int *)(CONCAT44(extraout_var,iVar3) + 0xc);
  iVar4 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
  if (*(long *)CONCAT44(extraout_var_00,iVar4) == 0) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = *(char **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 8);
  }
  spv::Builder::setDebugSourceLocation(this_00,iVar3,pcVar7);
  switch(node->flowOp) {
  case EOpKill:
    if ((this->glslangIntermediate->spvVersion).spv < 0x10600) {
      pcVar7 = "post-discard";
      opcode = OpKill;
      goto LAB_0043d0e3;
    }
    if (this->glslangIntermediate->source == EShSourceHlsl) {
      local_38[0] = CapabilityDemoteToHelperInvocation;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,local_38);
      spv::Builder::createNoResultOp(this_00,OpDemoteToHelperInvocation);
      return false;
    }
    break;
  case EOpTerminateInvocation:
    spv::Builder::addExtension(this_00,"SPV_KHR_terminate_invocation");
    break;
  case EOpDemote:
    spv::Builder::createNoResultOp(this_00,OpDemoteToHelperInvocation);
    spv::Builder::addExtension(this_00,"SPV_EXT_demote_to_helper_invocation");
    local_38[1] = 0x1503;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,local_38 + 1);
    return false;
  case EOpTerminateRayKHR:
    pcVar7 = "post-terminateRayKHR";
    opcode = OpTerminateRayKHR;
    goto LAB_0043d0e3;
  case EOpIgnoreIntersectionKHR:
    pcVar7 = "post-ignoreIntersectionKHR";
    opcode = OpIgnoreIntersectionKHR;
    goto LAB_0043d0e3;
  case EOpReturn:
    if (node->expression == (TIntermTyped *)0x0) {
      rValue = 0;
    }
    else {
      iVar3 = (*(node->expression->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      type = (TType *)CONCAT44(extraout_var_01,iVar3);
      rValue = accessChainLoad(this,type);
      pIVar2 = (this->builder).module.idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[rValue];
      if (pIVar2 == (Instruction *)0x0) {
        IVar5 = 0;
      }
      else {
        IVar5 = pIVar2->typeId;
      }
      if ((IVar5 != (this->currentFunction->functionInstruction).typeId) ||
         (iVar3 = (*type->_vptr_TType[0xb])(type),
         (*(uint *)(CONCAT44(extraout_var_02,iVar3) + 8) >> 0x19 & 7) - 3 < 0xfffffffe ==
         this->currentFunction->reducedPrecisionReturn)) {
        spv::Builder::clearAccessChain(this_00);
        DVar8 = DecorationMax;
        if (this->currentFunction->reducedPrecisionReturn != false) {
          DVar8 = DecorationRelaxedPrecision;
        }
        IVar5 = spv::Builder::createVariable
                          (this_00,DVar8,Function,
                           (this->currentFunction->functionInstruction).typeId,(char *)0x0,0,true);
        spv::Builder::setAccessChainLValue(this_00,IVar5);
        multiTypeStore(this,type,rValue);
        DVar8 = DecorationMax;
        if (this->currentFunction->reducedPrecisionReturn != false) {
          DVar8 = DecorationRelaxedPrecision;
        }
        rValue = spv::Builder::createLoad(this_00,IVar5,DVar8,MaskNone,Max,0);
      }
    }
    spv::Builder::makeReturn(this_00,false,rValue);
    spv::Builder::clearAccessChain(this_00);
    return false;
  case EOpBreak:
    pbVar6 = (this->breakForLoop).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pbVar6 == (this->breakForLoop).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pbVar6 = (this->breakForLoop).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
    }
    if (pbVar6[-1] == true) {
      spv::Builder::createLoopExit(this_00);
      return false;
    }
    spv::Builder::addSwitchBreak(this_00,false);
    return false;
  case EOpContinue:
    spv::Builder::createLoopContinue(this_00);
    return false;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x1297,
                  "virtual bool (anonymous namespace)::TGlslangToSpvTraverser::visitBranch(glslang::TVisit, glslang::TIntermBranch *)"
                 );
  }
  pcVar7 = "post-terminate-invocation";
  opcode = OpTerminateInvocation;
LAB_0043d0e3:
  spv::Builder::makeStatementTerminator(this_00,opcode,pcVar7);
  return false;
}

Assistant:

bool TGlslangToSpvTraverser::visitBranch(glslang::TVisit /* visit */, glslang::TIntermBranch* node)
{
    if (node->getExpression())
        node->getExpression()->traverse(this);

    builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());

    switch (node->getFlowOp()) {
    case glslang::EOpKill:
        if (glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_6) {
            if (glslangIntermediate->getSource() == glslang::EShSourceHlsl) {
              builder.addCapability(spv::CapabilityDemoteToHelperInvocation);
              builder.createNoResultOp(spv::OpDemoteToHelperInvocationEXT);
            } else {
                builder.makeStatementTerminator(spv::OpTerminateInvocation, "post-terminate-invocation");
            }
        } else {
            builder.makeStatementTerminator(spv::OpKill, "post-discard");
        }
        break;
    case glslang::EOpTerminateInvocation:
        builder.addExtension(spv::E_SPV_KHR_terminate_invocation);
        builder.makeStatementTerminator(spv::OpTerminateInvocation, "post-terminate-invocation");
        break;
    case glslang::EOpBreak:
        if (breakForLoop.top())
            builder.createLoopExit();
        else
            builder.addSwitchBreak(false);
        break;
    case glslang::EOpContinue:
        builder.createLoopContinue();
        break;
    case glslang::EOpReturn:
        if (node->getExpression() != nullptr) {
            const glslang::TType& glslangReturnType = node->getExpression()->getType();
            spv::Id returnId = accessChainLoad(glslangReturnType);
            if (builder.getTypeId(returnId) != currentFunction->getReturnType() ||
                TranslatePrecisionDecoration(glslangReturnType) != currentFunction->getReturnPrecision()) {
                builder.clearAccessChain();
                spv::Id copyId = builder.createVariable(currentFunction->getReturnPrecision(),
                    spv::StorageClassFunction, currentFunction->getReturnType());
                builder.setAccessChainLValue(copyId);
                multiTypeStore(glslangReturnType, returnId);
                returnId = builder.createLoad(copyId, currentFunction->getReturnPrecision());
            }
            builder.makeReturn(false, returnId);
        } else
            builder.makeReturn(false);

        builder.clearAccessChain();
        break;

    case glslang::EOpDemote:
        builder.createNoResultOp(spv::OpDemoteToHelperInvocationEXT);
        builder.addExtension(spv::E_SPV_EXT_demote_to_helper_invocation);
        builder.addCapability(spv::CapabilityDemoteToHelperInvocationEXT);
        break;
    case glslang::EOpTerminateRayKHR:
        builder.makeStatementTerminator(spv::OpTerminateRayKHR, "post-terminateRayKHR");
        break;
    case glslang::EOpIgnoreIntersectionKHR:
        builder.makeStatementTerminator(spv::OpIgnoreIntersectionKHR, "post-ignoreIntersectionKHR");
        break;

    default:
        assert(0);
        break;
    }

    return false;
}